

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

int __thiscall ncnn::Embed::load_param(Embed *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xd4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xd8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xdc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,0x12,0);
  *(int *)(in_RDI + 0xe0) = iVar1;
  return 0;
}

Assistant:

int Embed::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    input_dim = pd.get(1, 0);
    bias_term = pd.get(2, 0);
    weight_data_size = pd.get(3, 0);
    int8_scale_term = pd.get(18, 0);

    return 0;
}